

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteConstant<duckdb::string_t,duckdb::date_t,duckdb::date_t,duckdb::BinaryStandardOperatorWrapper,duckdb::DateTruncBinaryOperator,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  string_t left_00;
  bool bVar1;
  date_t dVar2;
  string_t *psVar3;
  date_t *pdVar4;
  date_t *pdVar5;
  Vector *in_RDX;
  date_t *result_data;
  date_t *rdata;
  string_t *ldata;
  char *idx;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  duckdb::Vector::SetVectorType((VectorType)in_RDX);
  psVar3 = ConstantVector::GetData<duckdb::string_t>((Vector *)0xc27de4);
  pdVar4 = ConstantVector::GetData<duckdb::date_t>((Vector *)0xc27df3);
  pdVar5 = ConstantVector::GetData<duckdb::date_t>((Vector *)0xc27e02);
  bVar1 = ConstantVector::IsNull((Vector *)0xc27e11);
  if ((!bVar1) && (bVar1 = ConstantVector::IsNull((Vector *)0xc27e1f), !bVar1)) {
    idx = (psVar3->value).pointer.ptr;
    ConstantVector::Validity(in_RDX);
    left_00.value.pointer.ptr = (char *)psVar3;
    left_00.value._0_8_ = pdVar4;
    dVar2 = BinaryStandardOperatorWrapper::
            Operation<bool,duckdb::DateTruncBinaryOperator,duckdb::string_t,duckdb::date_t,duckdb::date_t>
                      (SUB81((ulong)pdVar5 >> 0x18,0),left_00,(int32_t)((ulong)pdVar5 >> 0x20),
                       (ValidityMask *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                       ,(idx_t)idx);
    pdVar5->days = dVar2.days;
    return;
  }
  duckdb::ConstantVector::SetNull(in_RDX,true);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}